

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Am_Web_Data::Clear_Changed(Am_Web_Data *this)

{
  Input_Port *pIVar1;
  Input_Port *next;
  Input_Port *curr;
  Am_Web_Data *this_local;
  
  next = this->changed_first;
  while (next != (Input_Port *)0x0) {
    pIVar1 = next->next_changed;
    Am_Value::operator=(&next->prev_value,&Am_No_Value);
    next->changed = false;
    next->next_changed = (Input_Port *)0x0;
    next->prev_changed = (Input_Port *)0x0;
    next = pIVar1;
  }
  this->changed_first = (Input_Port *)0x0;
  this->changed_last = (Input_Port *)0x0;
  return;
}

Assistant:

void
Am_Web_Data::Clear_Changed()
{
  Input_Port *curr = changed_first;
  Input_Port *next;
  while (curr) {
    next = curr->next_changed;
    curr->prev_value = Am_No_Value;
    curr->changed = false;
    curr->next_changed = nullptr;
    curr->prev_changed = nullptr;
    curr = next;
  }
  changed_first = nullptr;
  changed_last = nullptr;
}